

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  if (iVar1 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls == 1) {
      if (timer_cb_calls == 1) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 0x95;
      }
      else {
        pcVar3 = "timer_cb_calls == 1";
        uVar2 = 0x93;
      }
    }
    else {
      pcVar3 = "timer_close_cb_calls == 1";
      uVar2 = 0x92;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x8e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  connection_fail(on_connect_without_close);

  ASSERT(timer_close_cb_calls == 1);
  ASSERT(timer_cb_calls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}